

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams::InternalSwap
          (CustomLayerParams *this,CustomLayerParams *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *psVar1;
  Arena *rhs_arena;
  Arena *lhs_arena;
  CustomLayerParams *other_local;
  CustomLayerParams *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::InternalSwap
            (&this->weights_,&other->weights_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::InternalSwap(&this->parameters_,&other->parameters_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->classname_,rhs_arena_00,&other->classname_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->description_,rhs_arena_00,&other->description_,lhs_arena_00);
  return;
}

Assistant:

void CustomLayerParams::InternalSwap(CustomLayerParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  parameters_.InternalSwap(&other->parameters_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &classname_, lhs_arena,
      &other->classname_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &description_, lhs_arena,
      &other->description_, rhs_arena
  );
}